

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_info_get_(MPIABI_Fint *info,char *key,MPIABI_Fint *valuelen,char *value,int *flag,
                     MPIABI_Fint *ierror,size_t key_len,size_t value_len)

{
  mpi_info_get_();
  return;
}

Assistant:

void mpiabi_info_get_(
  const MPIABI_Fint * info,
  const char * key,
  const MPIABI_Fint * valuelen,
  char * value,
  int * flag,
  MPIABI_Fint * ierror,
  size_t key_len,
  size_t value_len
) {
  return mpi_info_get_(
    info,
    key,
    valuelen,
    value,
    flag,
    ierror,
    key_len,
    value_len
  );
}